

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-token.c
# Opt level: O2

fy_token * fy_token_vcreate(fy_token_type type,__va_list_tag *ap)

{
  size_t *psVar1;
  fy_token *fyt;
  fy_input *pfVar2;
  size_t sVar3;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  uint uVar7;
  fy_token *fyt_00;
  ulong uVar8;
  long *plVar9;
  uint *puVar10;
  undefined8 *puVar11;
  
  if ((FYTT_INPUT_MARKER < type) || (fyt_00 = fy_token_alloc(), fyt_00 == (fy_token *)0x0)) {
    fyt_00 = (fy_token *)0x0;
    goto LAB_00136df4;
  }
  fyt_00->type = type;
  uVar8 = (ulong)ap->gp_offset;
  if (uVar8 < 0x29) {
    plVar9 = (long *)(uVar8 + (long)ap->reg_save_area);
    uVar7 = ap->gp_offset + 8;
    uVar8 = (ulong)uVar7;
    ap->gp_offset = uVar7;
  }
  else {
    plVar9 = (long *)ap->overflow_arg_area;
    ap->overflow_arg_area = plVar9 + 1;
  }
  psVar1 = (size_t *)*plVar9;
  if (psVar1 == (size_t *)0x0) goto LAB_00136df4;
  *(size_t *)&(fyt_00->handle).increment = psVar1[6];
  sVar3 = *psVar1;
  sVar4 = psVar1[1];
  sVar5 = psVar1[2];
  sVar6 = psVar1[3];
  pfVar2 = (fy_input *)psVar1[5];
  (fyt_00->handle).storage_hint = psVar1[4];
  (fyt_00->handle).fyi = pfVar2;
  (fyt_00->handle).end_mark.input_pos = sVar5;
  (fyt_00->handle).end_mark.line = (int)sVar6;
  (fyt_00->handle).end_mark.column = (int)(sVar6 >> 0x20);
  (fyt_00->handle).start_mark.input_pos = sVar3;
  (fyt_00->handle).start_mark.line = (int)sVar4;
  (fyt_00->handle).start_mark.column = (int)(sVar4 >> 0x20);
  if (type == FYTT_NONE) goto LAB_00136df4;
  uVar7 = (uint)uVar8;
  if (type == FYTT_SCALAR) {
    if (uVar7 < 0x29) {
      puVar10 = (uint *)(uVar8 + (long)ap->reg_save_area);
      ap->gp_offset = uVar7 + 8;
    }
    else {
      puVar10 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 2;
    }
    uVar7 = *puVar10;
    (fyt_00->field_9).tag_directive.tag_length = uVar7;
    if (4 < uVar7) goto LAB_00136df4;
    goto LAB_00136fc0;
  }
  if (type != FYTT_TAG) {
    if (type != FYTT_TAG_DIRECTIVE) goto LAB_00136fc0;
    if (uVar7 < 0x29) {
      ap->gp_offset = uVar7 + 8;
      (fyt_00->field_9).tag_directive.tag_length = *(uint *)((long)ap->reg_save_area + uVar8);
      if (0x20 < uVar7) goto LAB_00136f47;
      puVar10 = (uint *)((ulong)(uVar7 + 8) + (long)ap->reg_save_area);
      ap->gp_offset = uVar7 + 0x10;
    }
    else {
      puVar10 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 2;
      (fyt_00->field_9).tag_directive.tag_length = *puVar10;
LAB_00136f47:
      puVar10 = (uint *)ap->overflow_arg_area;
      ap->overflow_arg_area = puVar10 + 2;
    }
    (fyt_00->field_9).tag_directive.uri_length = *puVar10;
    goto LAB_00136fc0;
  }
  if (uVar7 < 0x29) {
    ap->gp_offset = (uint)(uVar8 + 8);
    (fyt_00->field_9).tag_directive.tag_length = *(uint *)((long)ap->reg_save_area + uVar8);
    if (0x20 < uVar7) goto LAB_00136f71;
    ap->gp_offset = (uint)(uVar8 + 0x10);
    (fyt_00->field_9).tag_directive.uri_length = *(uint *)((long)ap->reg_save_area + uVar8 + 8);
    if (0x18 < uVar7) goto LAB_00136f85;
    ap->gp_offset = uVar7 + 0x18;
    (fyt_00->field_9).tag.suffix_length = *(uint *)((long)ap->reg_save_area + uVar8 + 0x10);
    if (0x10 < uVar7) goto LAB_00136f99;
    puVar11 = (undefined8 *)((ulong)(uVar7 + 0x18) + (long)ap->reg_save_area);
    ap->gp_offset = uVar7 | 0x20;
  }
  else {
    puVar10 = (uint *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar10 + 2;
    (fyt_00->field_9).tag_directive.tag_length = *puVar10;
LAB_00136f71:
    puVar10 = (uint *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar10 + 2;
    (fyt_00->field_9).tag_directive.uri_length = *puVar10;
LAB_00136f85:
    puVar10 = (uint *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar10 + 2;
    (fyt_00->field_9).tag.suffix_length = *puVar10;
LAB_00136f99:
    puVar11 = (undefined8 *)ap->overflow_arg_area;
    ap->overflow_arg_area = puVar11 + 1;
  }
  fyt = (fy_token *)*puVar11;
  if (fyt == (fy_token *)0x0) {
LAB_00136df4:
    fy_token_unref(fyt_00);
    return (fy_token *)0x0;
  }
  fy_token_ref(fyt);
  (fyt_00->field_9).tag.fyt_td = fyt;
LAB_00136fc0:
  pfVar2 = (fyt_00->handle).fyi;
  if (pfVar2 != (fy_input *)0x0) {
    fy_input_ref(pfVar2);
    return fyt_00;
  }
  __assert_fail("fyt->handle.fyi",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/Dar9586[P]watson-c/src/external/libfyaml/fy-token.c"
                ,0x146,
                "struct fy_token *fy_token_vcreate(enum fy_token_type, struct __va_list_tag *)");
}

Assistant:

struct fy_token *fy_token_vcreate(enum fy_token_type type, va_list ap) {
    struct fy_token *fyt = NULL;
    struct fy_atom *handle;
    struct fy_token *fyt_td;

    if ((unsigned int) type > FYTT_INPUT_MARKER)
        goto err_out;

    fyt = fy_token_alloc();
    if (!fyt)
        goto err_out;
    fyt->type = type;

    handle = va_arg(ap, struct fy_atom *);
    if (!handle)
        goto err_out;
    fyt->handle = *handle;

    switch (fyt->type) {
        case FYTT_TAG_DIRECTIVE:
            fyt->tag_directive.tag_length = va_arg(ap, unsigned int);
            fyt->tag_directive.uri_length = va_arg(ap, unsigned int);
            break;
        case FYTT_SCALAR:
            fyt->scalar.style = va_arg(ap, enum fy_scalar_style);
            if ((unsigned int) fyt->scalar.style >= FYSS_MAX)
                goto err_out;
            break;
        case FYTT_TAG:
            fyt->tag.skip = va_arg(ap, unsigned int);
            fyt->tag.handle_length = va_arg(ap, unsigned int);
            fyt->tag.suffix_length = va_arg(ap, unsigned int);

            fyt_td = va_arg(ap, struct fy_token *);
            if (!fyt_td)
                goto err_out;
            fyt->tag.fyt_td = fy_token_ref(fyt_td);
            break;

        case FYTT_NONE:
            goto err_out;

        default:
            break;
    }

    assert(fyt->handle.fyi);

    /* take reference */
    fy_input_ref(fyt->handle.fyi);

    return fyt;

    err_out:
    fy_token_unref(fyt);

    return NULL;
}